

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O0

status asio::detail::
       reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>::
       do_perform(reactor_op *base)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  long in_RDI;
  bufs_type bufs;
  status result;
  reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_> *o;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  buffer_sequence_adapter<asio::const_buffer,_asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>
  *in_stack_fffffffffffffbd0;
  size_t *in_stack_fffffffffffffc08;
  error_code *in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc1c;
  size_t in_stack_fffffffffffffc20;
  buf *in_stack_fffffffffffffc28;
  socket_type in_stack_fffffffffffffc30;
  status local_14;
  
  buffer_sequence_adapter<asio::const_buffer,_asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>
  ::buffer_sequence_adapter
            (in_stack_fffffffffffffbd0,
             (prepared_buffers<asio::const_buffer,_64UL> *)
             CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  buffer_sequence_adapter<asio::const_buffer,_asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>
  ::buffers((buffer_sequence_adapter<asio::const_buffer,_asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>
             *)&stack0xfffffffffffffbd8);
  buffer_sequence_adapter<asio::const_buffer,_asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>
  ::count((buffer_sequence_adapter<asio::const_buffer,_asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>
           *)&stack0xfffffffffffffbd8);
  bVar2 = socket_ops::non_blocking_send
                    (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                     in_stack_fffffffffffffc1c,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  local_14 = (status)bVar2;
  if (((local_14 == done) && ((*(byte *)(in_RDI + 0x44) & 0x10) != 0)) &&
     (uVar1 = *(ulong *)(in_RDI + 0x30),
     sVar3 = buffer_sequence_adapter<asio::const_buffer,_asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>
             ::total_size((buffer_sequence_adapter<asio::const_buffer,_asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>
                           *)&stack0xfffffffffffffbd8), uVar1 < sVar3)) {
    local_14 = done_and_exhausted;
  }
  return local_14;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_send_op_base* o(
        static_cast<reactive_socket_send_op_base*>(base));

    typedef buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence> bufs_type;

    status result;
    if (bufs_type::is_single_buffer)
    {
      result = socket_ops::non_blocking_send1(o->socket_,
          bufs_type::first(o->buffers_).data(),
          bufs_type::first(o->buffers_).size(), o->flags_,
          o->ec_, o->bytes_transferred_) ? done : not_done;

      if (result == done)
        if ((o->state_ & socket_ops::stream_oriented) != 0)
          if (o->bytes_transferred_ < bufs_type::first(o->buffers_).size())
            result = done_and_exhausted;
    }
    else
    {
      bufs_type bufs(o->buffers_);
      result = socket_ops::non_blocking_send(o->socket_,
            bufs.buffers(), bufs.count(), o->flags_,
            o->ec_, o->bytes_transferred_) ? done : not_done;

      if (result == done)
        if ((o->state_ & socket_ops::stream_oriented) != 0)
          if (o->bytes_transferred_ < bufs.total_size())
            result = done_and_exhausted;
    }

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_send",
          o->ec_, o->bytes_transferred_));

    return result;
  }